

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O0

void __thiscall
SplitCompilationTest_empty_deque_long_Test<char16_t>::SplitCompilationTest_empty_deque_long_Test
          (SplitCompilationTest_empty_deque_long_Test<char16_t> *this)

{
  SplitCompilationTest_empty_deque_long_Test<char16_t> *this_local;
  
  SplitCompilationTest<char16_t>::SplitCompilationTest(&this->super_SplitCompilationTest<char16_t>);
  *(undefined ***)&this->super_SplitCompilationTest<char16_t> =
       &PTR__SplitCompilationTest_empty_deque_long_Test_008215e8;
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_deque_long) {
	std::basic_string_view<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>();
	EXPECT_TRUE(split<std::deque>(empty, delim).empty());
	EXPECT_TRUE(split_n<std::deque>(empty, delim, 5).empty());
	EXPECT_TRUE(split_view<std::deque>(empty, delim).empty());
	EXPECT_TRUE(split_n_view<std::deque>(empty, delim, 5).empty());
}